

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O0

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (ClockVisitor *this,CaseAssertionExpr *expr,Clock outerClock,
          bitmask<slang::analysis::VisitFlags> flags)

{
  bool bVar1;
  long in_RDX;
  span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *in_RSI;
  VisitResult *in_RDI;
  undefined4 in_R8D;
  ClockVisitor *unaff_retaddr;
  bitmask<slang::analysis::VisitFlags> in_stack_0000000c;
  ItemGroup *item;
  iterator __end2;
  iterator __begin2;
  span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *__range2;
  VisitResult *__lhs;
  bitmask<slang::analysis::VisitFlags> *in_stack_ffffffffffffff80;
  TimingControl **in_stack_ffffffffffffff88;
  ClockVisitor *in_stack_ffffffffffffff90;
  AssertionExpr *in_stack_ffffffffffffff98;
  __normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
  local_38;
  long local_30;
  long local_20;
  undefined4 in_stack_fffffffffffffff0;
  VisitResult *expr_00;
  
  local_30 = in_RDX + 0x18;
  __lhs = in_RDI;
  local_20 = in_RDX;
  expr_00 = in_RDI;
  local_38._M_current =
       (ItemGroup *)
       std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::begin
                 ((span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL> *)
                  in_RDI);
  std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>::end(in_RSI);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
                      ((__normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
                        *)__lhs,(__normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
                                 *)in_RDI);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
    ::operator*(&local_38);
    not_null<const_slang::ast::AssertionExpr_*>::operator->
              ((not_null<const_slang::ast::AssertionExpr_*> *)0x827949);
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    VisitResult::~VisitResult((VisitResult *)0x827975);
    __gnu_cxx::
    __normal_iterator<const_slang::ast::CaseAssertionExpr::ItemGroup_*,_std::span<const_slang::ast::CaseAssertionExpr::ItemGroup,_18446744073709551615UL>_>
    ::operator++(&local_38);
  }
  if (*(long *)(local_20 + 0x28) != 0) {
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80);
    VisitResult::~VisitResult((VisitResult *)0x8279c8);
  }
  inheritedClock(unaff_retaddr,(AssertionExpr *)expr_00,
                 (Clock)CONCAT44(in_R8D,in_stack_fffffffffffffff0),in_stack_0000000c);
  return __lhs;
}

Assistant:

VisitResult visit(const CaseAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        for (auto& item : expr.items)
            item.body->visit(*this, outerClock, flags);

        if (expr.defaultCase)
            expr.defaultCase->visit(*this, outerClock, flags);

        // Semantic leading clock is always inherited.
        return inheritedClock(expr, outerClock, flags);
    }